

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

bool __thiscall soul::heart::IODeclaration::canHandleType(IODeclaration *this,Type *t)

{
  Type *pTVar1;
  Type *pTVar2;
  bool bVar3;
  Type *pTVar4;
  Type local_60;
  Type local_48;
  
  pTVar1 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pTVar4 = pTVar2;
    if (pTVar4 == pTVar1) break;
    Type::Type(&local_60,pTVar4);
    getSampleArrayType(&local_48,this,&local_60);
    bVar3 = TypeRules::canSilentlyCastTo(&local_48,t);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_60.structure);
    pTVar2 = pTVar4 + 1;
  } while (!bVar3);
  return pTVar4 != pTVar1;
}

Assistant:

bool canHandleType (const Type& t) const
        {
            for (auto& type : dataTypes)
                if (TypeRules::canSilentlyCastTo (getSampleArrayType (type), t))
                    return true;

            return false;
        }